

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceFinder.cpp
# Opt level: O0

SelectionSet * __thiscall
OpenMD::DistanceFinder::find(DistanceFinder *this,SelectionSet *bs,RealType distance)

{
  bool bVar1;
  SnapshotManager *this_00;
  ulong uVar2;
  size_type sVar3;
  reference ppSVar4;
  size_t sVar5;
  reference ppMVar6;
  reference ppBVar7;
  Vector3d *pVVar8;
  reference ppBVar9;
  size_type sVar10;
  reference ppTVar11;
  reference ppIVar12;
  undefined8 *in_RSI;
  SelectionSet *in_RDI;
  double in_XMM0_Qa;
  double dVar13;
  Vector3d r_5;
  Vector3d loc_3;
  size_t j_6;
  Vector3d r_4;
  Vector3d loc_2;
  size_t j_5;
  Vector3d r_3;
  Vector3d loc_1;
  size_t j_4;
  Vector3d r_2;
  Vector3d loc;
  size_t j_3;
  Vector3d r_1;
  size_t j_2;
  Vector3d r;
  size_t j_1;
  size_t i;
  SelectionSet bsTemp;
  RigidBody *rb;
  uint j;
  Snapshot *currSnapshot;
  Vector3d centerPos;
  StuntDouble *center;
  SelectionSet *bsResult;
  SelectionSet *in_stack_fffffffffffffb08;
  Atom *in_stack_fffffffffffffb10;
  Atom *in_stack_fffffffffffffb18;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb20;
  SelectionSet *in_stack_fffffffffffffb58;
  SelectionSet *in_stack_fffffffffffffb60;
  Molecule *in_stack_fffffffffffffb68;
  Vector3d *in_stack_fffffffffffffb88;
  Snapshot *in_stack_fffffffffffffb90;
  RigidBody *in_stack_fffffffffffffca0;
  ulong local_340;
  size_type local_290;
  Vector3d *local_1f8;
  ulong local_178;
  ulong local_128;
  ulong local_d8;
  size_type local_b8;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> local_98;
  value_type local_80;
  uint local_78;
  byte local_49;
  Snapshot *local_48;
  value_type local_28;
  double local_20;
  
  local_20 = in_XMM0_Qa;
  Vector3<double>::Vector3((Vector3<double> *)0x427068);
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RSI);
  local_48 = SnapshotManager::getCurrentSnapshot(this_00);
  local_49 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb60,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb58);
  SelectionSet::SelectionSet
            (in_stack_fffffffffffffb60,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb58);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffb20);
  for (local_78 = 0; uVar2 = (ulong)local_78,
      sVar3 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::size
                        ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                         (in_RSI + 1)), uVar2 < sVar3; local_78 = local_78 + 1) {
    ppSVar4 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::operator[]
                        ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                         (in_RSI + 1),(ulong)local_78);
    if (*ppSVar4 != (value_type)0x0) {
      ppSVar4 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                           (in_RSI + 1),(ulong)local_78);
      bVar1 = StuntDouble::isRigidBody(*ppSVar4);
      if (bVar1) {
        ppSVar4 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                  operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                              *)(in_RSI + 1),(ulong)local_78);
        local_80 = *ppSVar4;
        RigidBody::updateAtoms(in_stack_fffffffffffffca0);
      }
    }
  }
  SelectionSet::SelectionSet((SelectionSet *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  SelectionSet::parallelReduce(in_stack_fffffffffffffb58);
  SelectionSet::operator=((SelectionSet *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  SelectionSet::~SelectionSet((SelectionSet *)0x427252);
  local_b8 = 0;
  while( true ) {
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (&local_98,0);
    sVar5 = OpenMDBitSet::size((OpenMDBitSet *)0x427287);
    if (sVar5 <= local_b8) break;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (&local_98,0);
    bVar1 = OpenMDBitSet::operator[]
                      ((OpenMDBitSet *)in_stack_fffffffffffffb10,
                       (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
    if (bVar1) {
      ppSVar4 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                           (in_RSI + 1),local_b8);
      local_28 = *ppSVar4;
      StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffb10,
                 (Vector3<double> *)in_stack_fffffffffffffb08);
      for (local_d8 = 0;
          sVar3 = std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::size
                            ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                             (in_RSI + 0x10)), local_d8 < sVar3; local_d8 = local_d8 + 1) {
        ppMVar6 = std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator[]
                            ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                             (in_RSI + 0x10),local_d8);
        if (*ppMVar6 != (value_type)0x0) {
          std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator[]
                    ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                     (in_RSI + 0x10),local_d8);
          Molecule::getCom(in_stack_fffffffffffffb68);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb18,
                            (Vector<double,_3U> *)in_stack_fffffffffffffb10);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          Snapshot::wrapVector(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          dVar13 = Vector<double,_3U>::length((Vector<double,_3U> *)0x427424);
          if (dVar13 <= local_20) {
            std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                      (&in_RDI->bitsets_,5);
            OpenMDBitSet::setBitOn
                      ((OpenMDBitSet *)in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08);
          }
        }
      }
      for (local_128 = 0;
          sVar3 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::size
                            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                              *)(in_RSI + 1)), local_128 < sVar3; local_128 = local_128 + 1) {
        ppSVar4 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                  operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                              *)(in_RSI + 1),local_128);
        if (*ppSVar4 != (value_type)0x0) {
          std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::operator[]
                    ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                     (in_RSI + 1),local_128);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb18,
                            (Vector<double,_3U> *)in_stack_fffffffffffffb10);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          Snapshot::wrapVector(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          dVar13 = Vector<double,_3U>::length((Vector<double,_3U> *)0x427599);
          if (dVar13 <= local_20) {
            std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                      (&in_RDI->bitsets_,0);
            OpenMDBitSet::setBitOn
                      ((OpenMDBitSet *)in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08);
          }
        }
      }
      for (local_178 = 0;
          sVar3 = std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::size
                            ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)(in_RSI + 4)
                            ), local_178 < sVar3; local_178 = local_178 + 1) {
        ppBVar7 = std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator[]
                            ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)(in_RSI + 4)
                             ,local_178);
        if (*ppBVar7 != (value_type)0x0) {
          std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator[]
                    ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)(in_RSI + 4),
                     local_178);
          Bond::getAtomA((Bond *)0x427683);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
          std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator[]
                    ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)(in_RSI + 4),
                     local_178);
          Bond::getAtomB((Bond *)0x4276c5);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          operator/((Vector<double,_3U> *)in_stack_fffffffffffffb18,
                    (double)in_stack_fffffffffffffb10);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffb18,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb10);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb18,
                            (Vector<double,_3U> *)in_stack_fffffffffffffb10);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          Snapshot::wrapVector(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          in_stack_fffffffffffffb90 =
               (Snapshot *)Vector<double,_3U>::length((Vector<double,_3U> *)0x42778d);
          if ((double)in_stack_fffffffffffffb90 <= local_20) {
            std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                      (&in_RDI->bitsets_,1);
            OpenMDBitSet::setBitOn
                      ((OpenMDBitSet *)in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08);
          }
        }
      }
      local_1f8 = (Vector3d *)0x0;
      while (in_stack_fffffffffffffb88 = local_1f8,
            pVVar8 = (Vector3d *)
                     std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::size
                               ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)
                                (in_RSI + 7)), in_stack_fffffffffffffb88 < pVVar8) {
        ppBVar9 = std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator[]
                            ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)(in_RSI + 7)
                             ,(size_type)local_1f8);
        if (*ppBVar9 != (value_type)0x0) {
          std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator[]
                    ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)(in_RSI + 7),
                     (size_type)local_1f8);
          Bend::getAtomA((Bend *)0x427878);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
          std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator[]
                    ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)(in_RSI + 7),
                     (size_type)local_1f8);
          Bend::getAtomB((Bend *)0x4278b4);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator[]
                    ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)(in_RSI + 7),
                     (size_type)local_1f8);
          Bend::getAtomC((Bend *)0x427907);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          operator/((Vector<double,_3U> *)in_stack_fffffffffffffb18,
                    (double)in_stack_fffffffffffffb10);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffb18,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb10);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb18,
                            (Vector<double,_3U> *)in_stack_fffffffffffffb10);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          Snapshot::wrapVector(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          in_stack_fffffffffffffb68 =
               (Molecule *)Vector<double,_3U>::length((Vector<double,_3U> *)0x4279c9);
          if ((double)in_stack_fffffffffffffb68 <= local_20) {
            std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                      (&in_RDI->bitsets_,2);
            OpenMDBitSet::setBitOn
                      ((OpenMDBitSet *)in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08);
          }
        }
        local_1f8 = (Vector3d *)((long)(local_1f8->super_Vector<double,_3U>).data_ + 1);
      }
      local_290 = 0;
      while (sVar3 = local_290,
            sVar10 = std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::size
                               ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)
                                (in_RSI + 10)), sVar3 < sVar10) {
        ppTVar11 = std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator[]
                             ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)
                              (in_RSI + 10),local_290);
        if (*ppTVar11 != (value_type)0x0) {
          std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator[]
                    ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)(in_RSI + 10),
                     local_290);
          Torsion::getAtomA((Torsion *)0x427aa8);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
          std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator[]
                    ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)(in_RSI + 10),
                     local_290);
          Torsion::getAtomB((Torsion *)0x427ae4);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator[]
                    ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)(in_RSI + 10),
                     local_290);
          Torsion::getAtomC((Torsion *)0x427b37);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator[]
                    ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)(in_RSI + 10),
                     local_290);
          Torsion::getAtomD((Torsion *)0x427b8a);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          operator/((Vector<double,_3U> *)in_stack_fffffffffffffb18,
                    (double)in_stack_fffffffffffffb10);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffb18,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb10);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb18,
                            (Vector<double,_3U> *)in_stack_fffffffffffffb10);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          Snapshot::wrapVector(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          dVar13 = Vector<double,_3U>::length((Vector<double,_3U> *)0x427c4c);
          if (dVar13 <= local_20) {
            std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                      (&in_RDI->bitsets_,3);
            OpenMDBitSet::setBitOn
                      ((OpenMDBitSet *)in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08);
          }
        }
        local_290 = local_290 + 1;
      }
      for (local_340 = 0;
          sVar3 = std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::size
                            ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                             (in_RSI + 0xd)), local_340 < sVar3; local_340 = local_340 + 1) {
        ppIVar12 = std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::
                   operator[]((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                              (in_RSI + 0xd),local_340);
        if (*ppIVar12 != (value_type)0x0) {
          std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator[]
                    ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                     (in_RSI + 0xd),local_340);
          Inversion::getAtomA((Inversion *)0x427d2b);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
          std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator[]
                    ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                     (in_RSI + 0xd),local_340);
          Inversion::getAtomB((Inversion *)0x427d67);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator[]
                    ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                     (in_RSI + 0xd),local_340);
          in_stack_fffffffffffffb18 = Inversion::getAtomC((Inversion *)0x427dba);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator[]
                    ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                     (in_RSI + 0xd),local_340);
          in_stack_fffffffffffffb10 = Inversion::getAtomD((Inversion *)0x427e0d);
          StuntDouble::getPos(&in_stack_fffffffffffffb18->super_StuntDouble);
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          operator/((Vector<double,_3U> *)in_stack_fffffffffffffb18,
                    (double)in_stack_fffffffffffffb10);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffb18,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb10);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffb18,
                            (Vector<double,_3U> *)in_stack_fffffffffffffb10);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffb10,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb08);
          Snapshot::wrapVector(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          in_stack_fffffffffffffb08 =
               (SelectionSet *)Vector<double,_3U>::length((Vector<double,_3U> *)0x427ecf);
          if ((double)in_stack_fffffffffffffb08 <= local_20) {
            std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                      (&in_RDI->bitsets_,4);
            OpenMDBitSet::setBitOn
                      ((OpenMDBitSet *)in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08);
          }
        }
      }
    }
    local_b8 = local_b8 + 1;
  }
  local_49 = 1;
  SelectionSet::~SelectionSet((SelectionSet *)0x427f5f);
  if ((local_49 & 1) == 0) {
    SelectionSet::~SelectionSet((SelectionSet *)0x427f76);
  }
  return in_RDI;
}

Assistant:

SelectionSet DistanceFinder::find(const SelectionSet& bs, RealType distance) {
    StuntDouble* center;
    Vector3d centerPos;
    Snapshot* currSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    SelectionSet bsResult(nObjects_);
    assert(bsResult.size() == bs.size());

#ifdef IS_MPI
    int mol;
    int proc;
    RealType data[3];
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
#endif

    for (unsigned int j = 0; j < stuntdoubles_.size(); ++j) {
      if (stuntdoubles_[j] != NULL) {
        if (stuntdoubles_[j]->isRigidBody()) {
          RigidBody* rb = static_cast<RigidBody*>(stuntdoubles_[j]);
          rb->updateAtoms();
        }
      }
    }

    SelectionSet bsTemp = bs;
    bsTemp              = bsTemp.parallelReduce();

    for (size_t i = 0; i < bsTemp.bitsets_[STUNTDOUBLE].size(); ++i) {
      if (bsTemp.bitsets_[STUNTDOUBLE][i]) {
#ifdef IS_MPI

        // Now, if we own stuntdouble i, we can use the position, but in
        // parallel, we'll need to let everyone else know what that
        // position is!

        mol  = info_->getGlobalMolMembership(i);
        proc = info_->getMolToProc(mol);

        if (proc == worldRank) {
          center    = stuntdoubles_[i];
          centerPos = center->getPos();
          data[0]   = centerPos.x();
          data[1]   = centerPos.y();
          data[2]   = centerPos.z();
          MPI_Bcast(data, 3, MPI_REALTYPE, proc, MPI_COMM_WORLD);
        } else {
          MPI_Bcast(data, 3, MPI_REALTYPE, proc, MPI_COMM_WORLD);
          centerPos = Vector3d(data);
        }
#else
        center    = stuntdoubles_[i];
        centerPos = center->getPos();
#endif
        for (size_t j = 0; j < molecules_.size(); ++j) {
          if (molecules_[j] != NULL) {
            Vector3d r = centerPos - molecules_[j]->getCom();
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[MOLECULE].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < stuntdoubles_.size(); ++j) {
          if (stuntdoubles_[j] != NULL) {
            Vector3d r = centerPos - stuntdoubles_[j]->getPos();
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[STUNTDOUBLE].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < bonds_.size(); ++j) {
          if (bonds_[j] != NULL) {
            Vector3d loc = bonds_[j]->getAtomA()->getPos();
            loc += bonds_[j]->getAtomB()->getPos();
            loc        = loc / 2.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) { bsResult.bitsets_[BOND].setBitOn(j); }
          }
        }
        for (size_t j = 0; j < bends_.size(); ++j) {
          if (bends_[j] != NULL) {
            Vector3d loc = bends_[j]->getAtomA()->getPos();
            loc += bends_[j]->getAtomB()->getPos();
            loc += bends_[j]->getAtomC()->getPos();
            loc        = loc / 3.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) { bsResult.bitsets_[BEND].setBitOn(j); }
          }
        }
        for (size_t j = 0; j < torsions_.size(); ++j) {
          if (torsions_[j] != NULL) {
            Vector3d loc = torsions_[j]->getAtomA()->getPos();
            loc += torsions_[j]->getAtomB()->getPos();
            loc += torsions_[j]->getAtomC()->getPos();
            loc += torsions_[j]->getAtomD()->getPos();
            loc        = loc / 4.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[TORSION].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < inversions_.size(); ++j) {
          if (inversions_[j] != NULL) {
            Vector3d loc = inversions_[j]->getAtomA()->getPos();
            loc += inversions_[j]->getAtomB()->getPos();
            loc += inversions_[j]->getAtomC()->getPos();
            loc += inversions_[j]->getAtomD()->getPos();
            loc        = loc / 4.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[INVERSION].setBitOn(j);
            }
          }
        }
      }
    }
    return bsResult;
  }